

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

bool withinB44ErrorBounds(uint16_t (*A) [4],uint16_t (*B) [4])

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  short sVar4;
  short sVar5;
  int i_1;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ostream *poVar11;
  byte bVar12;
  ushort uVar13;
  int i;
  uint uVar14;
  long lVar15;
  int iVar16;
  uint16_t (*pauVar17) [4];
  int i_3;
  int iVar18;
  int shift;
  ushort uVar19;
  int j;
  long lVar20;
  uint16_t (*pauVar21) [4];
  uint16_t A1 [16];
  int d [16];
  int aiStack_b8 [16];
  uint16_t (*local_78) [4];
  uint16_t (*local_70) [4];
  ulong local_68;
  ulong local_60;
  ushort auStack_58 [20];
  
  bVar3 = true;
  pauVar17 = A;
  pauVar21 = B;
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
      bVar3 = (bool)(bVar3 & (*pauVar17)[lVar20] == (*pauVar21)[lVar20]);
    }
    pauVar21 = pauVar21 + 1;
    pauVar17 = pauVar17 + 1;
  }
  if (!bVar3) {
    for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
      uVar13 = A[uVar9 >> 2 & 0x3fffffff][(uint)uVar9 & 3];
      if ((~uVar13 & 0x7c00) == 0) {
        auStack_58[uVar9] = 0x8000;
      }
      else {
        if ((short)uVar13 < 0) {
          uVar13 = ~uVar13;
        }
        else {
          uVar13 = uVar13 | 0x8000;
        }
        auStack_58[uVar9] = uVar13;
      }
    }
    uVar14 = 0;
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
      if ((ushort)uVar14 <= auStack_58[lVar15]) {
        uVar14 = (uint)auStack_58[lVar15];
      }
    }
    shift = -1;
    local_78 = A;
    local_70 = B;
    do {
      shift = shift + 1;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        iVar6 = shiftAndRound(uVar14 - auStack_58[lVar15],shift);
        d[lVar15] = iVar6;
      }
      iVar16 = (d[0] - d[4]) + 0x20;
      uVar7 = d[4] - d[8];
      local_68 = (ulong)uVar7;
      aiStack_b8[1] = uVar7 + 0x20;
      uVar8 = d[8] - d[0xc];
      local_60 = (ulong)uVar8;
      aiStack_b8[2] = uVar8 + 0x20;
      aiStack_b8[3] = (d[0] - d[1]) + 0x20;
      aiStack_b8[4] = (d[4] - d[5]) + 0x20;
      aiStack_b8[5] = (d[8] - d[9]) + 0x20;
      aiStack_b8[6] = (d[0xc] - d[0xd]) + 0x20;
      aiStack_b8[7] = (d[1] - d[2]) + 0x20;
      aiStack_b8[8] = (d[5] - d[6]) + 0x20;
      aiStack_b8[9] = (d[9] - d[10]) + 0x20;
      aiStack_b8[10] = (d[0xd] - d[0xe]) + 0x20;
      aiStack_b8[0xb] = (d[2] - d[3]) + 0x20;
      aiStack_b8[0xc] = (d[6] - d[7]) + 0x20;
      aiStack_b8[0xd] = (d[10] - d[0xb]) + 0x20;
      aiStack_b8[0xe] = (d[0xe] - d[0xf]) + 0x20;
      iVar6 = iVar16;
      iVar18 = iVar16;
      for (lVar15 = 1; lVar15 != 0xf; lVar15 = lVar15 + 1) {
        iVar2 = aiStack_b8[lVar15];
        if (iVar2 <= iVar18) {
          iVar18 = iVar2;
        }
        if (iVar6 <= iVar2) {
          iVar6 = iVar2;
        }
      }
    } while ((iVar18 < 0) || (0x3f < iVar6));
    bVar12 = (byte)shift;
    A1[0] = (ushort)uVar14 - (short)(d[0] << (bVar12 & 0x1f));
    sVar5 = (short)(-0x20 << (bVar12 & 0x1f));
    sVar4 = A1[0] + sVar5;
    A1[4] = (short)(iVar16 << (bVar12 & 0x1f)) + sVar4;
    A1[1] = (short)(aiStack_b8[3] << (bVar12 & 0x1f)) + sVar4;
    A1[8] = (short)(uVar7 << (bVar12 & 0x1f)) + A1[4];
    A1[0xc] = (short)(uVar8 + uVar7 << (bVar12 & 0x1f)) + A1[4];
    A1[5] = (short)(aiStack_b8[4] << (bVar12 & 0x1f)) + sVar5 + A1[4];
    A1[9] = (short)(aiStack_b8[5] << (bVar12 & 0x1f)) + sVar5 + A1[8];
    A1[0xd] = (short)(aiStack_b8[6] << (bVar12 & 0x1f)) + sVar5 + A1[0xc];
    A1[2] = (short)(aiStack_b8[7] << (bVar12 & 0x1f)) + sVar5 + A1[1];
    A1[6] = (short)(aiStack_b8[8] << (bVar12 & 0x1f)) + sVar5 + A1[5];
    A1[10] = (short)(aiStack_b8[9] << (bVar12 & 0x1f)) + sVar5 + A1[9];
    A1[0xe] = (short)(aiStack_b8[10] << (bVar12 & 0x1f)) + sVar5 + A1[0xd];
    A1[3] = (short)(aiStack_b8[0xb] << (bVar12 & 0x1f)) + sVar5 + A1[2];
    A1[7] = (short)(aiStack_b8[0xc] << (bVar12 & 0x1f)) + sVar5 + A1[6];
    A1[0xb] = (short)(aiStack_b8[0xd] << (bVar12 & 0x1f)) + sVar5 + A1[10];
    A1[0xf] = (short)(aiStack_b8[0xe] << (bVar12 & 0x1f)) + sVar5 + A1[0xe];
    for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
      uVar10 = uVar9 >> 2 & 0x3fffffff;
      uVar14 = (uint)uVar9 & 3;
      uVar13 = local_70[uVar10][uVar14];
      uVar19 = uVar13 | 0x8000;
      if ((short)uVar13 < 0) {
        uVar19 = ~uVar13;
      }
      uVar13 = A1[uVar9];
      if ((uVar13 + 5 < (uint)uVar19) || ((int)(uint)uVar19 < (int)(uVar13 - 5))) {
        uVar1 = local_78[uVar10][uVar14];
        poVar11 = std::operator<<((ostream *)&std::cerr,"B44 idx ");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,(uint)uVar9);
        poVar11 = std::operator<<(poVar11,": B bits ");
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar19);
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,*(float *)(_imath_half_to_float_table + (ulong)uVar19 * 4));
        poVar11 = std::operator<<(poVar11,") too different from A1 bits ");
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar13);
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,*(float *)(_imath_half_to_float_table + (ulong)uVar13 * 4));
        poVar11 = std::operator<<(poVar11,")");
        poVar11 = std::operator<<(poVar11," orig ");
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar1);
        *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
             *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar11 = std::operator<<(poVar11," (");
        poVar11 = (ostream *)
                  std::ostream::operator<<
                            (poVar11,*(float *)(_imath_half_to_float_table + (ulong)uVar1 * 4));
        poVar11 = std::operator<<(poVar11,")");
        std::endl<char,std::char_traits<char>>(poVar11);
        return 0xf < uVar9;
      }
    }
  }
  return true;
}

Assistant:

inline bool
withinB44ErrorBounds (const uint16_t A[4][4], const uint16_t B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    uint16_t t[16];

    for (int i = 0; i < 16; ++i)
    {
        uint16_t Abits = A[i / 4][i % 4];

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    uint16_t tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    uint16_t  A1[16];
    const int bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        uint16_t A1bits = A1[i];
        uint16_t Bbits  = B[i / 4][i % 4];
        uint16_t Abits  = A[i / 4][i % 4];

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5)
        {
            std::cerr << "B44 idx " << i << ": B bits " << std::hex << Bbits
                      << std::dec << " (" << imath_half_to_float (Bbits)
                      << ") too different from A1 bits " << std::hex << A1bits
                      << std::dec << " (" << imath_half_to_float (A1bits) << ")"
                      << " orig " << std::hex << Abits << std::dec << " ("
                      << imath_half_to_float (Abits) << ")" << std::endl;
            return false;
        }
    }

    return true;
}